

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O2

int mi_posix_memalign(void **p,size_t alignment,size_t size)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  
  iVar1 = 0x16;
  iVar2 = 0x16;
  if ((((alignment != 0) && (iVar2 = iVar1, p != (void **)0x0)) && ((alignment & 7) == 0)) &&
     (uVar4 = alignment - (alignment >> 1 & 0x5555555555555555),
     uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333),
     (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2)) {
    pvVar3 = mi_malloc_aligned(size,alignment);
    if (size == 0 || pvVar3 != (void *)0x0) {
      *p = pvVar3;
      iVar2 = 0;
    }
    else {
      iVar2 = 0xc;
    }
  }
  return iVar2;
}

Assistant:

int mi_posix_memalign(void** p, size_t alignment, size_t size) mi_attr_noexcept {
  // Note: The spec dictates we should not modify `*p` on an error. (issue#27)
  // <http://man7.org/linux/man-pages/man3/posix_memalign.3.html>
  if (p == NULL) return EINVAL;
  if ((alignment % sizeof(void*)) != 0) return EINVAL;                 // natural alignment
  // it is also required that alignment is a power of 2 and > 0; this is checked in `mi_malloc_aligned`
  if (alignment==0 || !_mi_is_power_of_two(alignment)) return EINVAL;  // not a power of 2
  void* q = mi_malloc_aligned(size, alignment);
  if (q==NULL && size != 0) return ENOMEM;
  mi_assert_internal(((uintptr_t)q % alignment) == 0);
  *p = q;
  return 0;
}